

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wthelper.h
# Opt level: O2

ktx_uint32_t
WriterTestHelper<unsigned_char,_3U,_32849U>::levelsFromSize
          (ktx_uint32_t width,ktx_uint32_t height,ktx_uint32_t depth)

{
  ktx_uint32_t kVar1;
  
  if (height < width) {
    height = width;
  }
  if (height <= depth) {
    height = depth;
  }
  kVar1 = 1;
  while( true ) {
    if (height == 1) break;
    kVar1 = kVar1 + 1;
    height = height >> 1;
  }
  return kVar1;
}

Assistant:

static ktx_uint32_t
    levelsFromSize(ktx_uint32_t width, ktx_uint32_t height, ktx_uint32_t depth) {
        ktx_uint32_t mipLevels;
        ktx_uint32_t max_dim = MAX(MAX(width, height), depth);
        for (mipLevels = 1; max_dim != 1; mipLevels++, max_dim >>= 1) { }
        return mipLevels;
    }